

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

void * mi_os_page_align_areax(_Bool conservative,void *addr,size_t size,size_t *newsize)

{
  void *pvVar1;
  void *pvVar2;
  uintptr_t uVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (newsize != (size_t *)0x0) {
    *newsize = 0;
  }
  sVar4 = mi_os_mem_config.page_size;
  if (addr == (void *)0x0 || size == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    if (conservative) {
      pvVar1 = (void *)_mi_align_up((uintptr_t)addr,mi_os_mem_config.page_size);
      uVar5 = size + (long)addr;
      if ((sVar4 & sVar4 - 1) == 0) {
        uVar3 = -sVar4 & uVar5;
      }
      else {
        uVar3 = uVar5 - uVar5 % sVar4;
      }
    }
    else {
      if ((mi_os_mem_config.page_size & mi_os_mem_config.page_size - 1) == 0) {
        pvVar1 = (void *)(-mi_os_mem_config.page_size & (ulong)addr);
      }
      else {
        pvVar1 = (void *)((long)addr - (ulong)addr % mi_os_mem_config.page_size);
      }
      uVar3 = _mi_align_up((long)addr + size,mi_os_mem_config.page_size);
    }
    sVar4 = uVar3 - (long)pvVar1;
    pvVar2 = (void *)0x0;
    if (0 < (long)sVar4) {
      pvVar2 = pvVar1;
    }
    if ((newsize != (size_t *)0x0) && (0 < (long)sVar4)) {
      *newsize = sVar4;
      pvVar2 = pvVar1;
    }
  }
  return pvVar2;
}

Assistant:

static void* mi_os_page_align_areax(bool conservative, void* addr, size_t size, size_t* newsize) {
  mi_assert(addr != NULL && size > 0);
  if (newsize != NULL) *newsize = 0;
  if (size == 0 || addr == NULL) return NULL;

  // page align conservatively within the range
  void* start = (conservative ? mi_align_up_ptr(addr, _mi_os_page_size())
    : mi_align_down_ptr(addr, _mi_os_page_size()));
  void* end = (conservative ? mi_align_down_ptr((uint8_t*)addr + size, _mi_os_page_size())
    : mi_align_up_ptr((uint8_t*)addr + size, _mi_os_page_size()));
  ptrdiff_t diff = (uint8_t*)end - (uint8_t*)start;
  if (diff <= 0) return NULL;

  mi_assert_internal((conservative && (size_t)diff <= size) || (!conservative && (size_t)diff >= size));
  if (newsize != NULL) *newsize = (size_t)diff;
  return start;
}